

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O1

Index __thiscall
IndividualBeliefJESP::GetAugmentedStateIndex
          (IndividualBeliefJESP *this,Index sI,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *oHist_others)

{
  uint uVar1;
  Index IVar2;
  LIndex i;
  uint uVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> withinStageOHIndices_o;
  Index local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  Index local_44;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  local_6c = sI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_40,
             (long)(oHist_others->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(oHist_others->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_68);
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      uVar1 = (oHist_others->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar4];
      i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                    (this->_m_pumadp,
                     (this->_m_others).super_SDT.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar4],this->_m_stage);
      IVar2 = Globals::CastLIndexToIndex(i);
      local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar1 - IVar2;
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < (ulong)((long)local_40.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)local_40.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,(iterator)0x0,&local_6c)
  ;
  local_44 = IndexTools::IndividualToJointIndicesStepSize(&local_40,this->_m_stepsizeJOHOH);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_68,
               (iterator)
               local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_44);
  }
  else {
    *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_44;
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  IVar2 = IndexTools::IndividualToJointIndicesStepSize(&local_68,this->_m_stepsizeSJOH);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar2;
}

Assistant:

Index 
IndividualBeliefJESP::GetAugmentedStateIndex(Index sI, 
        const vector<Index>& oHist_others) const
{
    //get indices without the offset for the stage:
    vector<Index> withinStageOHIndices_o = vector<Index>(oHist_others.size());
    for(Index j=0; j < withinStageOHIndices_o.size(); j++)
        withinStageOHIndices_o[j] = oHist_others[j] -
            CastLIndexToIndex(_m_pumadp->GetFirstObservationHistoryIndex( _m_others[j], _m_stage)); 

    vector<Index> v;
    v.push_back(sI);
    v.push_back(
        IndexTools::IndividualToJointIndicesStepSize(withinStageOHIndices_o, 
            _m_stepsizeJOHOH ) );
    return( IndexTools::IndividualToJointIndicesStepSize( v, 
            _m_stepsizeSJOH) );
}